

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4.h
# Opt level: O3

void ncnn::im2col_sgemm_pack4_sse
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int *piVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int nn;
  int iVar14;
  Allocator *pAVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  undefined1 (*pauVar20) [16];
  int iVar21;
  char cVar22;
  long lVar23;
  void **ppvVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  float *pfVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float zeros [4];
  undefined1 local_b8 [64];
  size_t local_78;
  uint local_64;
  ulong local_60;
  Mat *local_58;
  Mat *local_50;
  void *local_48;
  undefined8 uStack_40;
  
  uVar5 = bottom_im2col->w;
  iVar14 = bottom_im2col->h;
  uVar11 = bottom_im2col->c;
  uVar17 = (ulong)uVar11;
  local_60 = (ulong)(uint)top_blob->c;
  local_78 = 0;
  local_b8._0_8_ = (Allocator *)0x0;
  local_b8._8_4_ = 0;
  local_b8._12_4_ = 0;
  local_b8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_b8._24_4_ = 0;
  local_b8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  local_b8._32_8_ = local_b8._0_8_;
  local_b8._40_4_ = local_b8._8_4_;
  local_b8._44_4_ = local_b8._12_4_;
  local_58 = top_blob;
  local_50 = _bias;
  if ((long)(int)uVar5 < 0xc) {
    if ((int)uVar5 < 8) {
      if ((int)uVar5 < 4) {
        uVar25 = uVar5;
        iVar21 = iVar14;
        if (1 < (int)uVar5) {
          iVar21 = iVar14 * 2;
          uVar25 = (uVar5 & 1) + 1;
        }
      }
      else {
        uVar25 = (uVar5 & 1) + 1 + (uint)((uVar5 >> 1 & 1) != 0);
        iVar21 = iVar14 * 4;
      }
    }
    else {
      uVar25 = (uVar5 & 1) + 1 + (uVar5 >> 2 & 1) + (uint)((uVar5 >> 1 & 1) != 0);
      iVar21 = iVar14 * 8;
    }
    Mat::create((Mat *)local_b8,iVar21,uVar11,uVar25,0x10,4,(Allocator *)opt);
    uVar25 = (int)uVar5 / 0xc;
  }
  else {
    uVar25 = uVar5 / 0xc;
    uVar12 = uVar5 % 0xc;
    Mat::create((Mat *)local_b8,iVar14 * 0xc,uVar11,
                (uVar12 & 1) + (uVar12 >> 3) + uVar5 / 0xc + (uVar12 >> 2 & 1) +
                (uint)((uVar12 >> 1 & 1) != 0),0x10,4,(Allocator *)opt);
    uVar13 = 0;
    do {
      if (0 < (int)uVar11) {
        pAVar15 = (Allocator *)(local_b8._0_8_ + local_78 * uVar13 * local_b8._16_8_);
        uVar18 = 0;
        do {
          if (0 < iVar14) {
            pauVar20 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar18 +
                       ((long)((uVar13 << 0x24) * 3) >> 0x1e) + 0xb0);
            iVar21 = iVar14;
            do {
              auVar55 = vunpcklps_avx(pauVar20[-0xb],pauVar20[-10]);
              auVar52 = vunpcklps_avx(pauVar20[-9],pauVar20[-8]);
              auVar54 = vunpckhps_avx(pauVar20[-0xb],pauVar20[-10]);
              auVar53 = vunpckhps_avx(pauVar20[-9],pauVar20[-8]);
              auVar29 = vmovlhps_avx(auVar55,auVar52);
              auVar48 = vunpckhpd_avx(auVar55,auVar52);
              auVar55 = vmovlhps_avx(auVar54,auVar53);
              auVar46 = vunpckhpd_avx(auVar54,auVar53);
              auVar53 = vunpcklps_avx(pauVar20[-7],pauVar20[-6]);
              auVar44 = vunpcklps_avx(pauVar20[-5],pauVar20[-4]);
              auVar52 = vunpckhps_avx(pauVar20[-7],pauVar20[-6]);
              auVar50 = vunpckhps_avx(pauVar20[-5],pauVar20[-4]);
              auVar54 = vmovlhps_avx(auVar53,auVar44);
              auVar44 = vunpckhpd_avx(auVar53,auVar44);
              auVar53 = vmovlhps_avx(auVar52,auVar50);
              auVar41 = vunpckhpd_avx(auVar52,auVar50);
              auVar50 = vunpcklps_avx(pauVar20[-3],pauVar20[-2]);
              auVar38 = vunpcklps_avx(pauVar20[-1],*pauVar20);
              auVar34 = vunpckhps_avx(pauVar20[-3],pauVar20[-2]);
              auVar51 = vunpckhps_avx(pauVar20[-1],*pauVar20);
              auVar52 = vmovlhps_avx(auVar50,auVar38);
              auVar38 = vunpckhpd_avx(auVar50,auVar38);
              auVar50 = vmovlhps_avx(auVar34,auVar51);
              auVar34 = vunpckhpd_avx(auVar34,auVar51);
              *(undefined1 (*) [16])pAVar15 = auVar29;
              *(undefined1 (*) [16])(pAVar15 + 0x10) = auVar54;
              *(undefined1 (*) [16])(pAVar15 + 0x20) = auVar52;
              *(undefined1 (*) [16])(pAVar15 + 0x30) = auVar48;
              *(undefined1 (*) [16])(pAVar15 + 0x40) = auVar44;
              *(undefined1 (*) [16])(pAVar15 + 0x50) = auVar38;
              *(undefined1 (*) [16])(pAVar15 + 0x60) = auVar55;
              *(undefined1 (*) [16])(pAVar15 + 0x70) = auVar53;
              *(undefined1 (*) [16])(pAVar15 + 0x80) = auVar50;
              *(undefined1 (*) [16])(pAVar15 + 0x90) = auVar46;
              *(undefined1 (*) [16])(pAVar15 + 0xa0) = auVar41;
              *(undefined1 (*) [16])(pAVar15 + 0xb0) = auVar34;
              pAVar15 = pAVar15 + 0xc0;
              pauVar20 = (undefined1 (*) [16])(*pauVar20 + (ulong)(uVar5 * 4) * 4);
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar17);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar5 / 0xc);
  }
  iVar21 = uVar25 * 0xc;
  uVar25 = uVar5 + uVar25 * -0xc;
  uVar12 = (int)uVar25 >> 3;
  if (0 < (int)uVar12) {
    lVar16 = (long)iVar21 * 0x10 + 0x40;
    uVar13 = 0;
    do {
      if (0 < (int)uVar11) {
        iVar19 = iVar21 + (int)uVar13 * 8;
        iVar26 = iVar19 / 0xc;
        cVar22 = (char)iVar19 + (char)iVar26 * -0xc;
        pAVar15 = (Allocator *)
                  (local_b8._0_8_ +
                  (long)(((char)(((byte)(cVar22 >> 7) >> 5) + cVar22) >> 3) + iVar26) * local_78 *
                  local_b8._16_8_);
        uVar18 = 0;
        do {
          if (0 < iVar14) {
            pauVar20 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar18 + lVar16);
            iVar26 = iVar14;
            do {
              auVar55 = vunpcklps_avx(pauVar20[-4],pauVar20[-3]);
              auVar52 = vunpcklps_avx(pauVar20[-2],pauVar20[-1]);
              auVar54 = vunpckhps_avx(pauVar20[-4],pauVar20[-3]);
              auVar53 = vunpckhps_avx(pauVar20[-2],pauVar20[-1]);
              auVar29 = vmovlhps_avx(auVar55,auVar52);
              auVar52 = vunpckhpd_avx(auVar55,auVar52);
              auVar55 = vmovlhps_avx(auVar54,auVar53);
              auVar50 = vunpckhpd_avx(auVar54,auVar53);
              auVar53 = vunpcklps_avx(*pauVar20,pauVar20[1]);
              auVar48 = vunpcklps_avx(pauVar20[2],pauVar20[3]);
              auVar46 = vunpckhps_avx(*pauVar20,pauVar20[1]);
              auVar44 = vunpckhps_avx(pauVar20[2],pauVar20[3]);
              auVar54 = vmovlhps_avx(auVar53,auVar48);
              auVar48 = vunpckhpd_avx(auVar53,auVar48);
              auVar53 = vmovlhps_avx(auVar46,auVar44);
              auVar46 = vunpckhpd_avx(auVar46,auVar44);
              *(undefined1 (*) [16])pAVar15 = auVar29;
              *(undefined1 (*) [16])(pAVar15 + 0x10) = auVar54;
              *(undefined1 (*) [16])(pAVar15 + 0x20) = auVar52;
              *(undefined1 (*) [16])(pAVar15 + 0x30) = auVar48;
              *(undefined1 (*) [16])(pAVar15 + 0x40) = auVar55;
              *(undefined1 (*) [16])(pAVar15 + 0x50) = auVar53;
              *(undefined1 (*) [16])(pAVar15 + 0x60) = auVar50;
              *(undefined1 (*) [16])(pAVar15 + 0x70) = auVar46;
              pAVar15 = pAVar15 + 0x80;
              pauVar20 = (undefined1 (*) [16])(*pauVar20 + (long)(int)(uVar5 * 4) * 4);
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar17);
      }
      uVar13 = uVar13 + 1;
      lVar16 = lVar16 + 0x80;
    } while (uVar13 != uVar12);
  }
  iVar21 = (uVar25 & 0xfffffff8) + iVar21;
  uVar25 = (int)(uVar5 - iVar21) >> 2;
  if (0 < (int)uVar25) {
    lVar16 = (long)iVar21 * 0x10 + 0x30;
    uVar13 = 0;
    do {
      if (0 < (int)uVar11) {
        iVar19 = iVar21 + (int)uVar13 * 4;
        iVar26 = iVar19 / 0xc;
        cVar22 = (char)iVar19 + (char)iVar26 * -0xc;
        pAVar15 = (Allocator *)
                  (local_b8._0_8_ +
                  (long)((int)(char)(cVar22 % '\b' >> 2) +
                        ((char)(((byte)(cVar22 >> 7) >> 5) + cVar22) >> 3) + iVar26) * local_78 *
                  local_b8._16_8_);
        uVar18 = 0;
        do {
          if (0 < iVar14) {
            pauVar20 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar18 + lVar16);
            iVar26 = iVar14;
            do {
              auVar55 = vunpcklps_avx(pauVar20[-3],pauVar20[-2]);
              auVar54 = vunpcklps_avx(pauVar20[-1],*pauVar20);
              auVar53 = vunpckhps_avx(pauVar20[-3],pauVar20[-2]);
              auVar52 = vunpckhps_avx(pauVar20[-1],*pauVar20);
              auVar29 = vmovlhps_avx(auVar55,auVar54);
              auVar54 = vunpckhpd_avx(auVar55,auVar54);
              auVar55 = vmovlhps_avx(auVar53,auVar52);
              auVar53 = vunpckhpd_avx(auVar53,auVar52);
              *(undefined1 (*) [16])pAVar15 = auVar29;
              *(undefined1 (*) [16])(pAVar15 + 0x10) = auVar54;
              *(undefined1 (*) [16])(pAVar15 + 0x20) = auVar55;
              *(undefined1 (*) [16])(pAVar15 + 0x30) = auVar53;
              pAVar15 = pAVar15 + 0x40;
              pauVar20 = (undefined1 (*) [16])(*pauVar20 + (long)(int)(uVar5 * 4) * 4);
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar17);
      }
      uVar13 = uVar13 + 1;
      lVar16 = lVar16 + 0x40;
    } while (uVar13 != uVar25);
  }
  iVar21 = (uVar5 - iVar21 & 0xfffffffc) + iVar21;
  local_64 = uVar5 - iVar21;
  if (0 < (int)local_64 >> 1) {
    lVar16 = (long)iVar21 * 0x10 + 0x10;
    uVar13 = 0;
    do {
      if (0 < (int)uVar11) {
        iVar19 = iVar21 + (int)uVar13 * 2;
        iVar26 = iVar19 / 0xc;
        cVar22 = (char)iVar19 + (char)iVar26 * -0xc;
        pAVar15 = (Allocator *)
                  (local_b8._0_8_ +
                  (long)((int)(char)(cVar22 % '\x04' >> 1) +
                         ((char)(((byte)(cVar22 >> 7) >> 5) + cVar22) >> 3) + iVar26 +
                        (int)((char)(((byte)(cVar22 % '\b' >> 7) >> 6) + cVar22 % '\b') >> 2)) *
                  local_78 * local_b8._16_8_);
        uVar18 = 0;
        do {
          if (0 < iVar14) {
            lVar23 = bottom_im2col->cstep * bottom_im2col->elemsize * uVar18;
            lVar27 = (long)bottom_im2col->data + lVar16;
            iVar26 = iVar14;
            do {
              auVar29 = *(undefined1 (*) [16])(lVar27 + -0x10 + lVar23);
              auVar55 = *(undefined1 (*) [16])(lVar27 + lVar23);
              auVar54 = vunpcklps_avx(auVar29,auVar55);
              auVar29 = vunpckhps_avx(auVar29,auVar55);
              *(undefined1 (*) [16])pAVar15 = auVar54;
              *(undefined1 (*) [16])(pAVar15 + 0x10) = auVar29;
              pAVar15 = pAVar15 + 0x20;
              lVar27 = lVar27 + (long)(int)(uVar5 * 4) * 4;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar17);
      }
      uVar13 = uVar13 + 1;
      lVar16 = lVar16 + 0x20;
    } while (uVar13 != (uint)((int)local_64 >> 1));
  }
  iVar21 = (local_64 & 0xfffffffe) + iVar21;
  if (iVar21 < (int)uVar5) {
    lVar16 = (long)iVar21;
    lVar23 = lVar16 << 4;
    do {
      if (0 < (int)uVar11) {
        iVar21 = (int)lVar16 / 0xc;
        cVar22 = (char)lVar16 + (char)iVar21 * -0xc;
        pAVar15 = (Allocator *)
                  (local_b8._0_8_ +
                  (long)((int)(char)((cVar22 % '\x04') / '\x02') +
                         (int)(cVar22 % '\x02') +
                         ((char)(((byte)(cVar22 >> 7) >> 5) + cVar22) >> 3) + iVar21 +
                        (int)((char)(((byte)(cVar22 % '\b' >> 7) >> 6) + cVar22 % '\b') >> 2)) *
                  local_78 * local_b8._16_8_);
        uVar13 = 0;
        do {
          if (0 < iVar14) {
            pauVar20 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar13 + lVar23);
            iVar21 = iVar14;
            do {
              *(undefined1 (*) [16])pAVar15 = *pauVar20;
              pAVar15 = pAVar15 + 0x10;
              pauVar20 = (undefined1 (*) [16])(*pauVar20 + (long)(int)(uVar5 * 4) * 4);
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar17);
      }
      lVar16 = lVar16 + 1;
      lVar23 = lVar23 + 0x10;
    } while (lVar16 < (int)uVar5);
  }
  if (0 < (int)local_60) {
    iVar14 = iVar14 * uVar11;
    iVar21 = iVar14 * 4;
    uVar17 = 0;
    do {
      pauVar20 = (undefined1 (*) [16])
                 (local_58->cstep * uVar17 * local_58->elemsize + (long)local_58->data);
      ppvVar24 = &local_50->data + uVar17 * 2;
      if (local_50 == (Mat *)0x0) {
        ppvVar24 = &local_48;
      }
      local_48 = (void *)0x0;
      uStack_40 = 0;
      if ((int)uVar5 < 0xc) {
        uVar13 = 0;
      }
      else {
        uVar18 = 0;
        do {
          auVar29 = *(undefined1 (*) [16])ppvVar24;
          auVar55 = auVar29;
          auVar54 = auVar29;
          auVar53 = auVar29;
          auVar52 = auVar29;
          auVar50 = auVar29;
          auVar48 = auVar29;
          auVar46 = auVar29;
          auVar44 = auVar29;
          auVar41 = auVar29;
          auVar38 = auVar29;
          auVar34 = auVar29;
          if (0 < iVar14 * 4) {
            pfVar28 = (float *)(kernel->cstep * uVar17 * kernel->elemsize + (long)kernel->data);
            pAVar15 = (Allocator *)(local_b8._0_8_ + (uVar18 / 0xc) * local_78 * local_b8._16_8_);
            iVar26 = iVar21;
            auVar51 = auVar29;
            auVar49 = auVar29;
            auVar47 = auVar29;
            auVar45 = auVar29;
            auVar42 = auVar29;
            auVar39 = auVar29;
            auVar35 = auVar29;
            auVar30 = auVar29;
            auVar43 = auVar29;
            auVar40 = auVar29;
            auVar36 = auVar29;
            auVar31 = auVar29;
            do {
              fVar2 = *pfVar28;
              fVar3 = pfVar28[1];
              fVar4 = pfVar28[2];
              fVar6 = pfVar28[3];
              fVar1 = *(float *)pAVar15;
              auVar29._0_4_ = fVar1 * fVar2 + auVar51._0_4_;
              auVar29._4_4_ = fVar1 * fVar3 + auVar51._4_4_;
              auVar29._8_4_ = fVar1 * fVar4 + auVar51._8_4_;
              auVar29._12_4_ = fVar1 * fVar6 + auVar51._12_4_;
              fVar1 = *(float *)(pAVar15 + 4);
              auVar55._0_4_ = fVar1 * fVar2 + auVar31._0_4_;
              auVar55._4_4_ = fVar1 * fVar3 + auVar31._4_4_;
              auVar55._8_4_ = fVar1 * fVar4 + auVar31._8_4_;
              auVar55._12_4_ = fVar1 * fVar6 + auVar31._12_4_;
              fVar1 = *(float *)(pAVar15 + 8);
              auVar54._0_4_ = fVar1 * fVar2 + auVar36._0_4_;
              auVar54._4_4_ = fVar1 * fVar3 + auVar36._4_4_;
              auVar54._8_4_ = fVar1 * fVar4 + auVar36._8_4_;
              auVar54._12_4_ = fVar1 * fVar6 + auVar36._12_4_;
              fVar1 = *(float *)(pAVar15 + 0xc);
              auVar53._0_4_ = fVar1 * fVar2 + auVar40._0_4_;
              auVar53._4_4_ = fVar1 * fVar3 + auVar40._4_4_;
              auVar53._8_4_ = fVar1 * fVar4 + auVar40._8_4_;
              auVar53._12_4_ = fVar1 * fVar6 + auVar40._12_4_;
              fVar1 = *(float *)(pAVar15 + 0x10);
              auVar52._0_4_ = fVar1 * fVar2 + auVar43._0_4_;
              auVar52._4_4_ = fVar1 * fVar3 + auVar43._4_4_;
              auVar52._8_4_ = fVar1 * fVar4 + auVar43._8_4_;
              auVar52._12_4_ = fVar1 * fVar6 + auVar43._12_4_;
              fVar1 = *(float *)(pAVar15 + 0x14);
              auVar50._0_4_ = fVar1 * fVar2 + auVar30._0_4_;
              auVar50._4_4_ = fVar1 * fVar3 + auVar30._4_4_;
              auVar50._8_4_ = fVar1 * fVar4 + auVar30._8_4_;
              auVar50._12_4_ = fVar1 * fVar6 + auVar30._12_4_;
              fVar1 = *(float *)(pAVar15 + 0x18);
              auVar48._0_4_ = fVar1 * fVar2 + auVar35._0_4_;
              auVar48._4_4_ = fVar1 * fVar3 + auVar35._4_4_;
              auVar48._8_4_ = fVar1 * fVar4 + auVar35._8_4_;
              auVar48._12_4_ = fVar1 * fVar6 + auVar35._12_4_;
              fVar1 = *(float *)(pAVar15 + 0x1c);
              auVar46._0_4_ = fVar1 * fVar2 + auVar39._0_4_;
              auVar46._4_4_ = fVar1 * fVar3 + auVar39._4_4_;
              auVar46._8_4_ = fVar1 * fVar4 + auVar39._8_4_;
              auVar46._12_4_ = fVar1 * fVar6 + auVar39._12_4_;
              fVar1 = *(float *)(pAVar15 + 0x20);
              auVar44._0_4_ = fVar1 * fVar2 + auVar42._0_4_;
              auVar44._4_4_ = fVar1 * fVar3 + auVar42._4_4_;
              auVar44._8_4_ = fVar1 * fVar4 + auVar42._8_4_;
              auVar44._12_4_ = fVar1 * fVar6 + auVar42._12_4_;
              fVar1 = *(float *)(pAVar15 + 0x24);
              auVar41._0_4_ = fVar1 * fVar2 + auVar45._0_4_;
              auVar41._4_4_ = fVar1 * fVar3 + auVar45._4_4_;
              auVar41._8_4_ = fVar1 * fVar4 + auVar45._8_4_;
              auVar41._12_4_ = fVar1 * fVar6 + auVar45._12_4_;
              fVar1 = *(float *)(pAVar15 + 0x28);
              auVar38._0_4_ = fVar1 * fVar2 + auVar47._0_4_;
              auVar38._4_4_ = fVar1 * fVar3 + auVar47._4_4_;
              auVar38._8_4_ = fVar1 * fVar4 + auVar47._8_4_;
              auVar38._12_4_ = fVar1 * fVar6 + auVar47._12_4_;
              fVar1 = *(float *)(pAVar15 + 0x2c);
              auVar34._0_4_ = fVar1 * fVar2 + auVar49._0_4_;
              auVar34._4_4_ = fVar1 * fVar3 + auVar49._4_4_;
              auVar34._8_4_ = fVar1 * fVar4 + auVar49._8_4_;
              auVar34._12_4_ = fVar1 * fVar6 + auVar49._12_4_;
              pAVar15 = pAVar15 + 0x30;
              pfVar28 = pfVar28 + 4;
              iVar26 = iVar26 + -1;
              auVar51 = auVar29;
              auVar49 = auVar34;
              auVar47 = auVar38;
              auVar45 = auVar41;
              auVar42 = auVar44;
              auVar39 = auVar46;
              auVar35 = auVar48;
              auVar30 = auVar50;
              auVar43 = auVar52;
              auVar40 = auVar53;
              auVar36 = auVar54;
              auVar31 = auVar55;
            } while (iVar26 != 0);
          }
          *pauVar20 = auVar29;
          pauVar20[1] = auVar55;
          pauVar20[2] = auVar54;
          pauVar20[3] = auVar53;
          pauVar20[4] = auVar52;
          pauVar20[5] = auVar50;
          pauVar20[6] = auVar48;
          pauVar20[7] = auVar46;
          pauVar20[8] = auVar44;
          pauVar20[9] = auVar41;
          pauVar20[10] = auVar38;
          pauVar20[0xb] = auVar34;
          pauVar20 = pauVar20 + 0xc;
          uVar13 = uVar18 + 0xc;
          iVar26 = (int)uVar18;
          uVar18 = uVar13;
        } while (iVar26 + 0x17 < (int)uVar5);
      }
      iVar26 = (int)uVar13 + 7;
      while (uVar11 = (uint)uVar13, iVar26 < (int)uVar5) {
        auVar51 = *(undefined1 (*) [16])ppvVar24;
        auVar49 = auVar51;
        auVar47 = auVar51;
        auVar45 = auVar51;
        auVar42 = auVar51;
        auVar39 = auVar51;
        auVar35 = auVar51;
        auVar30 = auVar51;
        if (0 < iVar14 * 4) {
          lVar16 = local_78 * local_b8._16_8_ *
                   (ulong)((uVar11 + (int)((uVar13 & 0xffffffff) / 0xc) * -0xc >> 3) +
                          (int)((uVar13 & 0xffffffff) / 0xc));
          lVar23 = 0;
          iVar26 = iVar21;
          auVar29 = auVar51;
          auVar55 = auVar51;
          auVar54 = auVar51;
          auVar53 = auVar51;
          auVar52 = auVar51;
          auVar50 = auVar51;
          auVar48 = auVar51;
          auVar46 = auVar51;
          do {
            pfVar28 = (float *)((long)kernel->data +
                               lVar23 + kernel->cstep * uVar17 * kernel->elemsize);
            fVar2 = *pfVar28;
            fVar3 = pfVar28[1];
            fVar4 = pfVar28[2];
            fVar6 = pfVar28[3];
            fVar1 = *(float *)(local_b8._0_8_ + lVar23 * 2 + lVar16);
            auVar51._0_4_ = fVar1 * fVar2 + auVar46._0_4_;
            auVar51._4_4_ = fVar1 * fVar3 + auVar46._4_4_;
            auVar51._8_4_ = fVar1 * fVar4 + auVar46._8_4_;
            auVar51._12_4_ = fVar1 * fVar6 + auVar46._12_4_;
            fVar1 = *(float *)(local_b8._0_8_ + lVar23 * 2 + lVar16 + 4);
            auVar49._0_4_ = fVar1 * fVar2 + auVar48._0_4_;
            auVar49._4_4_ = fVar1 * fVar3 + auVar48._4_4_;
            auVar49._8_4_ = fVar1 * fVar4 + auVar48._8_4_;
            auVar49._12_4_ = fVar1 * fVar6 + auVar48._12_4_;
            fVar1 = *(float *)(local_b8._0_8_ + lVar23 * 2 + lVar16 + 8);
            auVar47._0_4_ = fVar1 * fVar2 + auVar50._0_4_;
            auVar47._4_4_ = fVar1 * fVar3 + auVar50._4_4_;
            auVar47._8_4_ = fVar1 * fVar4 + auVar50._8_4_;
            auVar47._12_4_ = fVar1 * fVar6 + auVar50._12_4_;
            fVar1 = *(float *)(local_b8._0_8_ + lVar23 * 2 + lVar16 + 0xc);
            auVar45._0_4_ = fVar1 * fVar2 + auVar52._0_4_;
            auVar45._4_4_ = fVar1 * fVar3 + auVar52._4_4_;
            auVar45._8_4_ = fVar1 * fVar4 + auVar52._8_4_;
            auVar45._12_4_ = fVar1 * fVar6 + auVar52._12_4_;
            fVar1 = *(float *)(local_b8._0_8_ + lVar23 * 2 + lVar16 + 0x10);
            auVar42._0_4_ = fVar1 * fVar2 + auVar53._0_4_;
            auVar42._4_4_ = fVar1 * fVar3 + auVar53._4_4_;
            auVar42._8_4_ = fVar1 * fVar4 + auVar53._8_4_;
            auVar42._12_4_ = fVar1 * fVar6 + auVar53._12_4_;
            fVar1 = *(float *)(local_b8._0_8_ + lVar23 * 2 + lVar16 + 0x14);
            auVar39._0_4_ = fVar1 * fVar2 + auVar54._0_4_;
            auVar39._4_4_ = fVar1 * fVar3 + auVar54._4_4_;
            auVar39._8_4_ = fVar1 * fVar4 + auVar54._8_4_;
            auVar39._12_4_ = fVar1 * fVar6 + auVar54._12_4_;
            fVar1 = *(float *)(local_b8._0_8_ + lVar23 * 2 + lVar16 + 0x18);
            auVar35._0_4_ = fVar1 * fVar2 + auVar55._0_4_;
            auVar35._4_4_ = fVar1 * fVar3 + auVar55._4_4_;
            auVar35._8_4_ = fVar1 * fVar4 + auVar55._8_4_;
            auVar35._12_4_ = fVar1 * fVar6 + auVar55._12_4_;
            fVar1 = *(float *)(local_b8._0_8_ + lVar23 * 2 + lVar16 + 0x1c);
            auVar30._0_4_ = fVar1 * fVar2 + auVar29._0_4_;
            auVar30._4_4_ = fVar1 * fVar3 + auVar29._4_4_;
            auVar30._8_4_ = fVar1 * fVar4 + auVar29._8_4_;
            auVar30._12_4_ = fVar1 * fVar6 + auVar29._12_4_;
            lVar23 = lVar23 + 0x10;
            iVar26 = iVar26 + -1;
            auVar29 = auVar30;
            auVar55 = auVar35;
            auVar54 = auVar39;
            auVar53 = auVar42;
            auVar52 = auVar45;
            auVar50 = auVar47;
            auVar48 = auVar49;
            auVar46 = auVar51;
          } while (iVar26 != 0);
        }
        *pauVar20 = auVar51;
        pauVar20[1] = auVar49;
        pauVar20[2] = auVar47;
        pauVar20[3] = auVar45;
        pauVar20[4] = auVar42;
        pauVar20[5] = auVar39;
        pauVar20[6] = auVar35;
        pauVar20[7] = auVar30;
        pauVar20 = pauVar20 + 8;
        uVar13 = (ulong)(uVar11 + 8);
        iVar26 = uVar11 + 0xf;
      }
      uVar11 = uVar11 | 3;
      while (uVar25 = (uint)uVar13, (int)uVar11 < (int)uVar5) {
        uVar11 = uVar25 + (int)((uVar13 & 0xffffffff) / 0xc) * -0xc;
        auVar43 = *(undefined1 (*) [16])ppvVar24;
        auVar40 = auVar43;
        auVar36 = auVar43;
        auVar31 = auVar43;
        if (0 < iVar14 * 4) {
          lVar16 = local_78 * local_b8._16_8_ *
                   (ulong)((uVar11 >> 3) + (int)((uVar13 & 0xffffffff) / 0xc) +
                          (uint)((uVar11 >> 2 & 1) != 0));
          lVar23 = 0;
          iVar26 = iVar21;
          auVar29 = auVar43;
          auVar55 = auVar43;
          auVar54 = auVar43;
          auVar53 = auVar43;
          do {
            pfVar28 = (float *)((long)kernel->data +
                               lVar23 + kernel->cstep * uVar17 * kernel->elemsize);
            fVar6 = *pfVar28;
            fVar7 = pfVar28[1];
            fVar8 = pfVar28[2];
            fVar9 = pfVar28[3];
            fVar1 = *(float *)(local_b8._0_8_ + lVar23 + lVar16);
            fVar2 = *(float *)(local_b8._0_8_ + lVar23 + lVar16 + 4);
            fVar3 = *(float *)(local_b8._0_8_ + lVar23 + lVar16 + 8);
            fVar4 = *(float *)(local_b8._0_8_ + lVar23 + lVar16 + 0xc);
            auVar43._0_4_ = fVar1 * fVar6 + auVar53._0_4_;
            auVar43._4_4_ = fVar1 * fVar7 + auVar53._4_4_;
            auVar43._8_4_ = fVar1 * fVar8 + auVar53._8_4_;
            auVar43._12_4_ = fVar1 * fVar9 + auVar53._12_4_;
            auVar40._0_4_ = fVar2 * fVar6 + auVar54._0_4_;
            auVar40._4_4_ = fVar2 * fVar7 + auVar54._4_4_;
            auVar40._8_4_ = fVar2 * fVar8 + auVar54._8_4_;
            auVar40._12_4_ = fVar2 * fVar9 + auVar54._12_4_;
            auVar36._0_4_ = fVar3 * fVar6 + auVar55._0_4_;
            auVar36._4_4_ = fVar3 * fVar7 + auVar55._4_4_;
            auVar36._8_4_ = fVar3 * fVar8 + auVar55._8_4_;
            auVar36._12_4_ = fVar3 * fVar9 + auVar55._12_4_;
            auVar31._0_4_ = fVar4 * fVar6 + auVar29._0_4_;
            auVar31._4_4_ = fVar4 * fVar7 + auVar29._4_4_;
            auVar31._8_4_ = fVar4 * fVar8 + auVar29._8_4_;
            auVar31._12_4_ = fVar4 * fVar9 + auVar29._12_4_;
            lVar23 = lVar23 + 0x10;
            iVar26 = iVar26 + -1;
            auVar29 = auVar31;
            auVar55 = auVar36;
            auVar54 = auVar40;
            auVar53 = auVar43;
          } while (iVar26 != 0);
        }
        *pauVar20 = auVar43;
        pauVar20[1] = auVar40;
        pauVar20[2] = auVar36;
        pauVar20[3] = auVar31;
        pauVar20 = pauVar20 + 4;
        uVar13 = (ulong)(uVar25 + 4);
        uVar11 = uVar25 + 7;
      }
      uVar25 = uVar25 | 1;
      while (iVar26 = (int)uVar13, (int)uVar25 < (int)uVar5) {
        uVar11 = iVar26 + (int)((uVar13 & 0xffffffff) / 0xc) * -0xc;
        auVar37 = *(undefined1 (*) [16])ppvVar24;
        auVar32 = auVar37;
        if (0 < iVar14 * 4) {
          pfVar28 = (float *)(kernel->cstep * uVar17 * kernel->elemsize + (long)kernel->data);
          lVar16 = local_78 * local_b8._16_8_ *
                   (ulong)((uVar11 >> 2 & 1) + (uVar11 >> 3) + (int)((uVar13 & 0xffffffff) / 0xc) +
                          (uint)((uVar11 >> 1 & 1) != 0));
          lVar23 = 0;
          auVar29 = auVar37;
          auVar55 = auVar37;
          do {
            fVar1 = *(float *)(local_b8._0_8_ + lVar23 * 8 + lVar16);
            fVar2 = *(float *)(local_b8._0_8_ + lVar23 * 8 + lVar16 + 4);
            auVar37._0_4_ = fVar1 * *pfVar28 + auVar55._0_4_;
            auVar37._4_4_ = fVar1 * pfVar28[1] + auVar55._4_4_;
            auVar37._8_4_ = fVar1 * pfVar28[2] + auVar55._8_4_;
            auVar37._12_4_ = fVar1 * pfVar28[3] + auVar55._12_4_;
            auVar32._0_4_ = fVar2 * *pfVar28 + auVar29._0_4_;
            auVar32._4_4_ = fVar2 * pfVar28[1] + auVar29._4_4_;
            auVar32._8_4_ = fVar2 * pfVar28[2] + auVar29._8_4_;
            auVar32._12_4_ = fVar2 * pfVar28[3] + auVar29._12_4_;
            pfVar28 = pfVar28 + 4;
            lVar23 = lVar23 + 1;
            auVar29 = auVar32;
            auVar55 = auVar37;
          } while (iVar21 != (int)lVar23);
        }
        *pauVar20 = auVar37;
        pauVar20[1] = auVar32;
        pauVar20 = pauVar20 + 2;
        uVar13 = (ulong)(iVar26 + 2);
        uVar25 = iVar26 + 3;
      }
      if (iVar26 < (int)uVar5) {
        do {
          uVar11 = (uint)uVar13;
          uVar25 = uVar11 + (int)((uVar13 & 0xffffffff) / 0xc) * -0xc;
          auVar33 = *(undefined1 (*) [16])ppvVar24;
          if (0 < iVar14 * 4) {
            pfVar28 = (float *)(kernel->cstep * uVar17 * kernel->elemsize + (long)kernel->data);
            lVar16 = 0;
            auVar29 = auVar33;
            do {
              fVar1 = *(float *)(local_b8._0_8_ +
                                lVar16 * 4 +
                                local_78 * local_b8._16_8_ *
                                (ulong)((uVar25 >> 2 & 1) +
                                        (uVar11 & 1) + (int)((uVar13 & 0xffffffff) / 0xc) +
                                        (uVar25 >> 3) + (uint)((uVar25 >> 1 & 1) != 0)));
              auVar33._0_4_ = fVar1 * *pfVar28 + auVar29._0_4_;
              auVar33._4_4_ = fVar1 * pfVar28[1] + auVar29._4_4_;
              auVar33._8_4_ = fVar1 * pfVar28[2] + auVar29._8_4_;
              auVar33._12_4_ = fVar1 * pfVar28[3] + auVar29._12_4_;
              pfVar28 = pfVar28 + 4;
              lVar16 = lVar16 + 1;
              auVar29 = auVar33;
            } while (iVar21 != (int)lVar16);
          }
          *pauVar20 = auVar33;
          pauVar20 = pauVar20 + 1;
          uVar13 = (ulong)(uVar11 + 1);
        } while (uVar11 + 1 != uVar5);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != local_60);
  }
  piVar10 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_b8._0_8_ != (Allocator *)0x0) {
          free((void *)local_b8._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_b8._32_8_ + 0x18))();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u * 4, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 12)
        tmp.create(12 * maxk, inch, size / 12 + (size % 12) / 8 + (size % 12 % 8) / 4 + (size % 12 % 4) / 2 + size % 12 % 2, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + (size % 4) / 2 + size % 2, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 4u * 4, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u * 4, 4, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size / 12;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 12;

            float* tmpptr = tmp.channel(i / 12);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x12
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);
                    __m128 _r8 = _mm_load_ps(img0 + 4 * 8);
                    __m128 _r9 = _mm_load_ps(img0 + 4 * 9);
                    __m128 _ra = _mm_load_ps(img0 + 4 * 10);
                    __m128 _rb = _mm_load_ps(img0 + 4 * 11);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r8);
                    _mm_store_ps(tmpptr + 4 * 3, _r1);
                    _mm_store_ps(tmpptr + 4 * 4, _r5);
                    _mm_store_ps(tmpptr + 4 * 5, _r9);
                    _mm_store_ps(tmpptr + 4 * 6, _r2);
                    _mm_store_ps(tmpptr + 4 * 7, _r6);
                    _mm_store_ps(tmpptr + 4 * 8, _ra);
                    _mm_store_ps(tmpptr + 4 * 9, _r3);
                    _mm_store_ps(tmpptr + 4 * 10, _r7);
                    _mm_store_ps(tmpptr + 4 * 11, _rb);

                    img0 += size * 4;
                    tmpptr += 48;
                }
            }
        }

        remain_size_start += nn_size * 12;
        nn_size = (size - remain_size_start) >> 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x8
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r1);
                    _mm_store_ps(tmpptr + 4 * 3, _r5);
                    _mm_store_ps(tmpptr + 4 * 4, _r2);
                    _mm_store_ps(tmpptr + 4 * 5, _r6);
                    _mm_store_ps(tmpptr + 4 * 6, _r3);
                    _mm_store_ps(tmpptr + 4 * 7, _r7);

                    img0 += size * 4;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x4
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r1);
                    _mm_store_ps(tmpptr + 4 * 2, _r2);
                    _mm_store_ps(tmpptr + 4 * 3, _r3);

                    img0 += size * 4;
                    tmpptr += 16;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x2
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);

                    __m128 _r01_0 = _mm_unpacklo_ps(_r0, _r1);
                    __m128 _r01_1 = _mm_unpackhi_ps(_r0, _r1);

                    _mm_store_ps(tmpptr, _r01_0);
                    _mm_store_ps(tmpptr + 4, _r01_1);

                    img0 += size * 4;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 11 < size; i += 12)
        {
            const float* tmpptr = tmp.channel(i / 12);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;
            __m128 _sum8 = _sum0;
            __m128 _sum9 = _sum0;
            __m128 _suma = _sum0;
            __m128 _sumb = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);
                __m128 _val8 = _mm_load1_ps(tmpptr + 8);
                __m128 _val9 = _mm_load1_ps(tmpptr + 9);
                __m128 _vala = _mm_load1_ps(tmpptr + 10);
                __m128 _valb = _mm_load1_ps(tmpptr + 11);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);
                _sum8 = _mm_comp_fmadd_ps(_val8, _w0, _sum8);
                _sum9 = _mm_comp_fmadd_ps(_val9, _w0, _sum9);
                _suma = _mm_comp_fmadd_ps(_vala, _w0, _suma);
                _sumb = _mm_comp_fmadd_ps(_valb, _w0, _sumb);

                tmpptr += 12;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 4 * 2, _sum2);
            _mm_store_ps(outptr0 + 4 * 3, _sum3);
            _mm_store_ps(outptr0 + 4 * 4, _sum4);
            _mm_store_ps(outptr0 + 4 * 5, _sum5);
            _mm_store_ps(outptr0 + 4 * 6, _sum6);
            _mm_store_ps(outptr0 + 4 * 7, _sum7);
            _mm_store_ps(outptr0 + 4 * 8, _sum8);
            _mm_store_ps(outptr0 + 4 * 9, _sum9);
            _mm_store_ps(outptr0 + 4 * 10, _suma);
            _mm_store_ps(outptr0 + 4 * 11, _sumb);

            outptr0 += 4 * 12;
        }
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 4 * 2, _sum2);
            _mm_store_ps(outptr0 + 4 * 3, _sum3);
            _mm_store_ps(outptr0 + 4 * 4, _sum4);
            _mm_store_ps(outptr0 + 4 * 5, _sum5);
            _mm_store_ps(outptr0 + 4 * 6, _sum6);
            _mm_store_ps(outptr0 + 4 * 7, _sum7);

            outptr0 += 4 * 8;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 4 * 2, _sum2);
            _mm_store_ps(outptr0 + 4 * 3, _sum3);

            outptr0 += 4 * 4;
        }
        for (; i + 1 < size; i += 2)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);

                tmpptr += 2;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);

            outptr0 += 4 * 2;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _val0 = _mm_load1_ps(tmpptr);
                _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum);

            outptr0 += 4;
        }
    }
}